

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O1

void __thiscall
cbtPairCachingGhostObject::cbtPairCachingGhostObject(cbtPairCachingGhostObject *this)

{
  cbtHashedOverlappingPairCache *this_00;
  
  cbtCollisionObject::cbtCollisionObject((cbtCollisionObject *)this);
  (this->super_cbtGhostObject).m_overlappingObjects.m_ownsMemory = true;
  (this->super_cbtGhostObject).m_overlappingObjects.m_data = (cbtCollisionObject **)0x0;
  (this->super_cbtGhostObject).m_overlappingObjects.m_size = 0;
  (this->super_cbtGhostObject).m_overlappingObjects.m_capacity = 0;
  (this->super_cbtGhostObject).super_cbtCollisionObject.m_internalType = 4;
  (this->super_cbtGhostObject).super_cbtCollisionObject._vptr_cbtCollisionObject =
       (_func_int **)&PTR__cbtPairCachingGhostObject_00b70e08;
  this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
  cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
  this->m_hashPairCache = this_00;
  return;
}

Assistant:

cbtPairCachingGhostObject::cbtPairCachingGhostObject()
{
	m_hashPairCache = new (cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16)) cbtHashedOverlappingPairCache();
}